

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_flac_seek_to_pcm_frame(ma_flac *pFlac,ma_uint64 frameIndex)

{
  ma_bool32 mVar1;
  
  if (pFlac != (ma_flac *)0x0) {
    mVar1 = ma_dr_flac_seek_to_pcm_frame(pFlac->dr,frameIndex);
    return -(uint)(mVar1 != 1);
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_flac_seek_to_pcm_frame(ma_flac* pFlac, ma_uint64 frameIndex)
{
    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        ma_bool32 flacResult;

        flacResult = ma_dr_flac_seek_to_pcm_frame(pFlac->dr, frameIndex);
        if (flacResult != MA_TRUE) {
            return MA_ERROR;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}